

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompt.c
# Opt level: O0

kp_error_t kp_readpass(kp_ctx *ctx,_Bool confirm,char *password,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  undefined8 in_RCX;
  char *in_RDX;
  byte in_SIL;
  __gnuc_va_list in_R8;
  char *confirmation;
  char *prompt;
  char *prompt_fmt;
  kp_error_t ret;
  char *local_48;
  char *local_40;
  char *local_38;
  kp_error_t local_2c;
  __gnuc_va_list local_28;
  char *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_2c = 0;
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_28 = in_R8;
  local_18 = in_RDX;
  iVar1 = asprintf(&local_38,"[kickpass] %s password: ",in_RCX);
  if (iVar1 < 0) {
    kp_err(5,"cannot build prompt");
  }
  iVar1 = vasprintf(&local_40,local_38,local_28);
  if (iVar1 < 0) {
    kp_err(5,"cannot build prompt");
  }
  lVar2 = readpassphrase(local_40,local_18,0x1000,2);
  if (lVar2 == 0) {
    local_2c = 5;
    kp_warn(5,"cannot read password");
  }
  else if ((local_9 & 1) != 0) {
    local_48 = (char *)sodium_malloc(0x1000);
    if (local_48 == (char *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0xc;
      local_2c = 5;
      kp_warn(5,"memory error");
    }
    else {
      lVar2 = readpassphrase("[kickpass] confirm: ",local_48,0x1000,2);
      if (lVar2 == 0) {
        local_2c = 5;
        kp_warn(5,"cannot read password");
      }
      else {
        iVar1 = strncmp(local_18,local_48,0x1000);
        if (iVar1 != 0) {
          local_2c = 2;
          kp_warn(2,"mismatching password");
        }
      }
    }
  }
  free(local_38);
  free(local_40);
  sodium_free(local_48);
  return local_2c;
}

Assistant:

kp_error_t
kp_readpass(struct kp_ctx *ctx, bool confirm, char *password, const char *fmt, va_list ap)
{
	kp_error_t ret = KP_SUCCESS;
	char *prompt_fmt = NULL, *prompt = NULL;
	char *confirmation = NULL;

	assert(fmt);
	assert(password);

	if (asprintf(&prompt_fmt, PASSWORD_PROMPT, fmt) < 0) {
		kp_err(KP_ERRNO, "cannot build prompt");
	}

	if (vasprintf(&prompt, prompt_fmt, ap) < 0) {
		kp_err(KP_ERRNO, "cannot build prompt");
	}

	if (readpassphrase(prompt, password, KP_PASSWORD_MAX_LEN,
				RPP_ECHO_OFF | RPP_REQUIRE_TTY) == NULL) {
		ret = KP_ERRNO;
		kp_warn(ret, "cannot read password");
		goto out;
	}

	if (confirm) {
		confirmation = sodium_malloc(KP_PASSWORD_MAX_LEN);
		if (!confirmation) {
			errno = ENOMEM;
			ret = KP_ERRNO;
			kp_warn(ret, "memory error");
			goto out;
		}

		if (readpassphrase(PASSWORD_CONFIRM_PROMPT, confirmation,
					KP_PASSWORD_MAX_LEN,
					RPP_ECHO_OFF | RPP_REQUIRE_TTY)
				== NULL) {
			ret = KP_ERRNO;
			kp_warn(ret, "cannot read password");
			goto out;
		}

		if (strncmp(password, confirmation, KP_PASSWORD_MAX_LEN) != 0) {
			ret = KP_EINPUT;
			kp_warn(ret, "mismatching password");
			goto out;
		}
	}

out:
	free(prompt_fmt);
	free(prompt);
	sodium_free(confirmation);

	return ret;
}